

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_urlencode.cpp
# Opt level: O2

string * urlencode(string *__return_storage_ptr__,string *c)

{
  byte bVar1;
  uint uVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (uint)c->_M_string_length;
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      return __return_storage_ptr__;
    }
    pcVar3 = (c->_M_dataplus)._M_p;
    bVar1 = pcVar3[uVar5];
    if ((char)bVar1 < '0') {
      if (1 < (byte)(bVar1 - 0x2d)) goto LAB_0012ae2f;
LAB_0012ae1b:
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(pcVar3 + uVar5));
    }
    else {
      if (bVar1 < 0x3a) goto LAB_0012ae1b;
      if (bVar1 < 0x41) goto LAB_0012ae2f;
      if (bVar1 < 0x5b) goto LAB_0012ae1b;
      if (bVar1 < 0x61) {
        if (bVar1 == 0x5f) goto LAB_0012ae1b;
      }
      else if (bVar1 == 0x7e || bVar1 < 0x7b) goto LAB_0012ae1b;
LAB_0012ae2f:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      char2hex_abi_cxx11_(&local_50,(c->_M_dataplus)._M_p[uVar5]);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::string urlencode( const std::string c)
{ 
	std::string escaped;
	int max = c.length();
	for(int i=0; i<max; i++)
	{
		if ( (48 <= c[i] && c[i] <= 57) ||   //0-9
			(65 <= c[i] && c[i] <= 90) ||      //ABC...XYZ
			(97 <= c[i] && c[i] <= 122) ||     //abc...xyz
			(c[i]=='~' || c[i]=='-' || c[i]=='_' || c[i]=='.')
			)
		{
			escaped.append( &c[i], 1);
		}
		else
		{
			escaped.append("%");
			escaped.append( char2hex(c[i]) );//converts char 255 to string "FF"
		}
	}
	return escaped;
}